

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O2

int __thiscall Bstrlib::CBString::operator_cast_to_int(CBString *this)

{
  int iVar1;
  CBStringException *this_00;
  allocator local_5d;
  int d;
  string local_58;
  CBStringException bstr__cppwrapper_exception;
  
  d = 0;
  iVar1 = __isoc99_sscanf((this->super_tagbstring).data,"%d");
  if (iVar1 == 1) {
    return d;
  }
  std::__cxx11::string::string
            ((string *)&local_58,"CBString::Unable to convert to an int",&local_5d);
  CBStringException::CBStringException(&bstr__cppwrapper_exception,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  this_00 = (CBStringException *)__cxa_allocate_exception(0x28);
  CBStringException::CBStringException(this_00,&bstr__cppwrapper_exception);
  __cxa_throw(this_00,&CBStringException::typeinfo,CBStringException::~CBStringException);
}

Assistant:

CBString::operator int () const {
int d = 0;
	if (1 != sscanf ((const char *)this->data, "%d", &d)) {
		bstringThrow ("Unable to convert to an int");
	}
	return d;
}